

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void ImportModuleTypedefs(ExpressionContext *ctx,SynBase *source,ModuleContext *moduleCtx)

{
  ByteCode *code;
  InplaceStr name;
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  ExternTypedefInfo *pEVar6;
  size_t sVar7;
  undefined4 extraout_var;
  TypeBase *type;
  TypeBase *pTVar8;
  undefined4 extraout_var_00;
  char *pcVar9;
  ulong uVar10;
  char *local_58;
  InplaceStr aliasName;
  TraceScope traceScope;
  AliasData *this;
  
  if (ImportModuleTypedefs(ExpressionContext&,SynBase*,ModuleContext&)::token == '\0') {
    iVar2 = __cxa_guard_acquire(&ImportModuleTypedefs(ExpressionContext&,SynBase*,ModuleContext&)::
                                 token);
    if (iVar2 != 0) {
      ImportModuleTypedefs::token = NULLC::TraceGetToken("analyze","ImportModuleTypedefs");
      __cxa_guard_release(&ImportModuleTypedefs(ExpressionContext&,SynBase*,ModuleContext&)::token);
    }
  }
  NULLC::TraceScope::TraceScope(&traceScope,ImportModuleTypedefs::token);
  code = moduleCtx->data->bytecode;
  pcVar5 = FindSymbols(code);
  pEVar6 = FindFirstTypedef(code);
  uVar10 = 0;
  local_58 = "ERROR: type \'%.*s\' alias \'%s\' is equal to previously imported class";
  do {
    if (code->typedefCount <= uVar10) {
      NULLC::TraceScope::~TraceScope(&traceScope);
      return;
    }
    pcVar9 = pcVar5 + pEVar6->offsetToName;
    aliasName.begin = pcVar9;
    sVar7 = strlen(pcVar9);
    aliasName.end = pcVar9 + sVar7;
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    name.end = aliasName.end;
    name.begin = aliasName.begin;
    SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var,iVar2),name);
    type = GetImportedModuleTypeAt(ctx,source,moduleCtx,pEVar6->targetType);
    if (type == (TypeBase *)0x0) {
      anon_unknown.dwarf_94284::Stop
                (ctx,source,"ERROR: can\'t find alias \'%s\' target type in module %.*s",
                 pcVar5 + pEVar6->offsetToName,
                 (ulong)(uint)(*(int *)&(moduleCtx->data->name).end -
                              (int)(moduleCtx->data->name).begin));
    }
    uVar3 = InplaceStr::hash(&aliasName);
    pTVar8 = anon_unknown.dwarf_94284::LookupTypeByName(ctx,uVar3);
    if (pTVar8 == (TypeBase *)0x0) {
      if (pEVar6->parentType == 0xffffffff) {
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
        this = (AliasData *)CONCAT44(extraout_var_00,iVar4);
        uVar3 = ctx->uniqueAliasId;
        ctx->uniqueAliasId = uVar3 + 1;
        AliasData::AliasData
                  (this,source,ctx->scope,type,(SynIdentifier *)CONCAT44(extraout_var,iVar2),uVar3);
        this->importModule = moduleCtx->data;
        ExpressionContext::AddAlias(ctx,this);
      }
    }
    else {
      bVar1 = InplaceStr::operator==(&pTVar8->name,&aliasName);
      if (bVar1) {
LAB_00167425:
        pcVar9 = (type->name).begin;
        anon_unknown.dwarf_94284::Stop
                  (ctx,source,local_58,(ulong)(uint)(*(int *)&(type->name).end - (int)pcVar9),pcVar9
                   ,pcVar5 + pEVar6->offsetToName);
      }
      if (pTVar8 != type) {
        local_58 = "ERROR: type \'%.*s\' alias \'%s\' is equal to previously imported alias";
        goto LAB_00167425;
      }
    }
    uVar10 = uVar10 + 1;
    pEVar6 = pEVar6 + 1;
  } while( true );
}

Assistant:

void ImportModuleTypedefs(ExpressionContext &ctx, SynBase *source, ModuleContext &moduleCtx)
{
	TRACE_SCOPE("analyze", "ImportModuleTypedefs");

	ByteCode *bCode = moduleCtx.data->bytecode;
	char *symbols = FindSymbols(bCode);

	// Import type aliases
	ExternTypedefInfo *aliasList = FindFirstTypedef(bCode);

	for(unsigned i = 0; i < bCode->typedefCount; i++)
	{
		ExternTypedefInfo &alias = aliasList[i];

		InplaceStr aliasName = InplaceStr(symbols + alias.offsetToName);

		SynIdentifier *aliasNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(aliasName);

		TypeBase *targetType = GetImportedModuleTypeAt(ctx, source, moduleCtx, alias.targetType);

		if(!targetType)
			Stop(ctx, source, "ERROR: can't find alias '%s' target type in module %.*s", symbols + alias.offsetToName, FMT_ISTR(moduleCtx.data->name));

		if(TypeBase *type = LookupTypeByName(ctx, aliasName.hash()))
		{
			if(type->name == aliasName)
				Stop(ctx, source, "ERROR: type '%.*s' alias '%s' is equal to previously imported class", FMT_ISTR(targetType->name), symbols + alias.offsetToName);

			if(type != targetType)
				Stop(ctx, source, "ERROR: type '%.*s' alias '%s' is equal to previously imported alias", FMT_ISTR(targetType->name), symbols + alias.offsetToName);
		}
		else if(alias.parentType != ~0u)
		{
			// Type alises were imported during type import
		}
		else
		{
			AliasData *alias = new (ctx.get<AliasData>()) AliasData(source, ctx.scope, targetType, aliasNameIdentifier, ctx.uniqueAliasId++);

			alias->importModule = moduleCtx.data;

			ctx.AddAlias(alias);
		}
	}
}